

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.hpp
# Opt level: O2

void __thiscall
EOPlus::Parser::Parser<std::_Deque_iterator<EOPlus::Token,EOPlus::Token&,EOPlus::Token*>>
          (Parser *this,Quest *quest,
          _Deque_iterator<EOPlus::Token,_EOPlus::Token_&,_EOPlus::Token_*> *begin,
          _Deque_iterator<EOPlus::Token,_EOPlus::Token_&,_EOPlus::Token_*> *end)

{
  Parser_Token_Server<std::_Deque_iterator<EOPlus::Token,_EOPlus::Token_&,_EOPlus::Token_*>_>
  *this_00;
  _Deque_iterator<EOPlus::Token,_EOPlus::Token_&,_EOPlus::Token_*> local_68;
  _Deque_iterator<EOPlus::Token,_EOPlus::Token_&,_EOPlus::Token_*> local_48;
  
  this->quest = quest;
  this_00 = (Parser_Token_Server<std::_Deque_iterator<EOPlus::Token,_EOPlus::Token_&,_EOPlus::Token_*>_>
             *)operator_new(0xf8);
  local_48._M_cur = begin->_M_cur;
  local_48._M_first = begin->_M_first;
  local_48._M_last = begin->_M_last;
  local_48._M_node = begin->_M_node;
  local_68._M_cur = end->_M_cur;
  local_68._M_first = end->_M_first;
  local_68._M_last = end->_M_last;
  local_68._M_node = end->_M_node;
  Parser_Token_Server<std::_Deque_iterator<EOPlus::Token,_EOPlus::Token_&,_EOPlus::Token_*>_>::
  Parser_Token_Server(this_00,&local_48,&local_68);
  (this->tok)._M_t.
  super___uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
  ._M_t.
  super__Tuple_impl<0UL,_EOPlus::Parser_Token_Server_Base_*,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
  .super__Head_base<0UL,_EOPlus::Parser_Token_Server_Base_*,_false>._M_head_impl =
       (Parser_Token_Server_Base *)this_00;
  return;
}

Assistant:

Parser(Quest& quest, IT begin, IT end)
				: quest(quest)
				, tok(new Parser_Token_Server<IT>(begin, end))
			{ }